

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O3

back_insert_iterator<std::vector<testing::Matcher<const_std::shared_ptr<const_bssl::ParsedCertificate>_&>,_std::allocator<testing::Matcher<const_std::shared_ptr<const_bssl::ParsedCertificate>_&>_>_>_>
 __thiscall
testing::internal::
TransformTupleValuesHelper<std::tuple<std::shared_ptr<const_bssl::ParsedCertificate>,_std::shared_ptr<const_bssl::ParsedCertificate>_>,_testing::internal::CastAndAppendTransform<const_std::shared_ptr<const_bssl::ParsedCertificate>_&>,_std::back_insert_iterator<std::vector<testing::Matcher<const_std::shared_ptr<const_bssl::ParsedCertificate>_&>,_std::allocator<testing::Matcher<const_std::shared_ptr<const_bssl::ParsedCertificate>_&>_>_>_>_>
::
IterateOverTuple<std::tuple<std::shared_ptr<const_bssl::ParsedCertificate>,_std::shared_ptr<const_bssl::ParsedCertificate>_>,_2UL>
::operator()(undefined8 param_1,long param_2,
            vector<testing::Matcher<std::shared_ptr<bssl::ParsedCertificate_const>const&>,std::allocator<testing::Matcher<std::shared_ptr<bssl::ParsedCertificate_const>const&>>>
            *param_3)

{
  back_insert_iterator<std::vector<testing::Matcher<const_std::shared_ptr<const_bssl::ParsedCertificate>_&>,_std::allocator<testing::Matcher<const_std::shared_ptr<const_bssl::ParsedCertificate>_&>_>_>_>
  bVar1;
  MatcherBase<const_std::shared_ptr<const_bssl::ParsedCertificate>_&> local_30;
  
  Matcher<const_std::shared_ptr<const_bssl::ParsedCertificate>_&>::Matcher
            ((Matcher<const_std::shared_ptr<const_bssl::ParsedCertificate>_&> *)&local_30,
             (shared_ptr<const_bssl::ParsedCertificate> *)(param_2 + 0x10));
  std::
  vector<testing::Matcher<std::shared_ptr<bssl::ParsedCertificate_const>const&>,std::allocator<testing::Matcher<std::shared_ptr<bssl::ParsedCertificate_const>const&>>>
  ::emplace_back<testing::Matcher<std::shared_ptr<bssl::ParsedCertificate_const>const&>>
            (param_3,(Matcher<const_std::shared_ptr<const_bssl::ParsedCertificate>_&> *)&local_30);
  MatcherBase<const_std::shared_ptr<const_bssl::ParsedCertificate>_&>::~MatcherBase(&local_30);
  bVar1 = IterateOverTuple<std::tuple<std::shared_ptr<const_bssl::ParsedCertificate>,_std::shared_ptr<const_bssl::ParsedCertificate>_>,_1UL>
          ::operator()((IterateOverTuple<std::tuple<std::shared_ptr<const_bssl::ParsedCertificate>,_std::shared_ptr<const_bssl::ParsedCertificate>_>,_1UL>
                        *)&local_30,param_2,param_3);
  return (back_insert_iterator<std::vector<testing::Matcher<const_std::shared_ptr<const_bssl::ParsedCertificate>_&>,_std::allocator<testing::Matcher<const_std::shared_ptr<const_bssl::ParsedCertificate>_&>_>_>_>
          )bVar1.container;
}

Assistant:

OutIter operator()(Func f, const Tup& t, OutIter out) const {
      *out++ = f(::std::get<TupleSize::value - kRemainingSize>(t));
      return IterateOverTuple<Tup, kRemainingSize - 1>()(f, t, out);
    }